

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

void encode_ext(upb_encstate *e,upb_Extension *ext,_Bool is_message_set)

{
  byte bVar1;
  uint uVar2;
  upb_MiniTableExtension *puVar3;
  char *pcVar4;
  undefined7 in_register_00000011;
  upb_MiniTable *m;
  upb_MiniTableSub local_20;
  
  if ((int)CONCAT71(in_register_00000011,is_message_set) == 0) {
    puVar3 = ext->ext;
    local_20.submsg_dont_copy_me__upb_internal_use_only =
         (upb_MiniTable *)&puVar3->sub_dont_copy_me__upb_internal_use_only;
    if (((puVar3->field_dont_copy_me__upb_internal_use_only).
         descriptortype_dont_copy_me__upb_internal_use_only & 0xfe) != 10) {
      local_20 = *(upb_MiniTableSub *)local_20.submsg_dont_copy_me__upb_internal_use_only;
    }
    encode_field(e,(upb_Message *)&(ext->data).str_val,(upb_MiniTableSubInternal *)&local_20,
                 &puVar3->field_dont_copy_me__upb_internal_use_only);
  }
  else {
    encode_tag(e,1,'\x04');
    puVar3 = ext->ext;
    bVar1 = (puVar3->field_dont_copy_me__upb_internal_use_only).
            descriptortype_dont_copy_me__upb_internal_use_only;
    if (((puVar3->field_dont_copy_me__upb_internal_use_only).
         mode_dont_copy_me__upb_internal_use_only & 0x10) == 0) {
      if ((ulong)(bVar1 - 1) - 9 < 2) {
        m = (puVar3->sub_dont_copy_me__upb_internal_use_only).
            submsg_dont_copy_me__upb_internal_use_only;
      }
      else {
        m = (upb_MiniTable *)0x0;
      }
    }
    else {
      m = (upb_MiniTable *)0x0;
      if ((bVar1 != 5) && (m = (upb_MiniTable *)0x0, bVar1 != 0xc)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/mini_table/internal/field.h"
                      ,0x7b,
                      "upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)");
      }
    }
    encode_message(e,(ext->data).msg_val,m,(size_t *)&local_20);
    if (((ulong)local_20 < (upb_MiniTable *)0x80) && (pcVar4 = e->ptr, pcVar4 != e->buf)) {
      e->ptr = pcVar4 + -1;
      pcVar4[-1] = local_20._0_1_;
    }
    else {
      encode_longvarint(e,(uint64_t)local_20);
    }
    encode_tag(e,3,'\x02');
    uVar2 = (ext->ext->field_dont_copy_me__upb_internal_use_only).
            number_dont_copy_me__upb_internal_use_only;
    if (((ulong)uVar2 < 0x80) && (pcVar4 = e->ptr, pcVar4 != e->buf)) {
      e->ptr = pcVar4 + -1;
      pcVar4[-1] = (char)uVar2;
    }
    else {
      encode_longvarint(e,(ulong)uVar2);
    }
    encode_tag(e,2,'\0');
    encode_tag(e,1,'\x03');
  }
  return;
}

Assistant:

static void encode_ext(upb_encstate* e, const upb_Extension* ext,
                       bool is_message_set) {
  if (UPB_UNLIKELY(is_message_set)) {
    encode_msgset_item(e, ext);
  } else {
    upb_MiniTableSubInternal sub;
    if (upb_MiniTableField_IsSubMessage(&ext->ext->UPB_PRIVATE(field))) {
      sub.UPB_PRIVATE(submsg) = &ext->ext->UPB_PRIVATE(sub).UPB_PRIVATE(submsg);
    } else {
      sub.UPB_PRIVATE(subenum) =
          ext->ext->UPB_PRIVATE(sub).UPB_PRIVATE(subenum);
    }
    encode_field(e, (upb_Message*)&ext->data, &sub,
                 &ext->ext->UPB_PRIVATE(field));
  }
}